

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScanner.cpp
# Opt level: O1

Grammar * __thiscall
xercesc_4_0::XMLScanner::loadGrammar
          (XMLScanner *this,XMLCh *systemId,short grammarType,bool toCache)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Grammar *pGVar3;
  URLInputSource *this_00;
  LastExtEntityInfo lastInfo;
  XMLResourceIdentifier resourceIdentifier;
  XMLException local_b8;
  XMLURL local_88;
  undefined4 extraout_var_00;
  
  if (this->fEntityHandler == (XMLEntityHandler *)0x0) {
    this_00 = (URLInputSource *)0x0;
  }
  else {
    ReaderMgr::getLastExtEntityInfo(&this->fReaderMgr,(LastExtEntityInfo *)&local_b8);
    local_88._vptr_XMLURL._0_4_ = 4;
    local_88.fMemoryManager = (MemoryManager *)&XMLUni::fgZeroLenString;
    local_88.fHost = (XMLCh *)local_b8._vptr_XMLException;
    local_88.fPassword = (XMLCh *)0x0;
    local_88.fFragment = systemId;
    local_88.fPath = (XMLCh *)&this->fReaderMgr;
    iVar2 = (*this->fEntityHandler->_vptr_XMLEntityHandler[5])();
    this_00 = (URLInputSource *)CONCAT44(extraout_var,iVar2);
  }
  if (this_00 == (URLInputSource *)0x0) {
    if (this->fDisableDefaultEntityResolution == false) {
      XMLURL::XMLURL(&local_88,this->fMemoryManager);
      bVar1 = XMLURL::parse(systemId,&local_88);
      if (bVar1) {
        bVar1 = XMLURL::isRelative(&local_88);
        if (bVar1) {
          if (this->fStandardUriConformant != false) {
            MalformedURLException::MalformedURLException
                      ((MalformedURLException *)&local_b8,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLScanner.cpp"
                       ,0x6b0,URL_NoProtocolPresent,this->fMemoryManager);
            this->fInException = true;
            emitError(this,XMLException_Fatal,local_b8.fCode,local_b8.fMsg,(XMLCh *)0x0,(XMLCh *)0x0
                      ,(XMLCh *)0x0);
            goto LAB_002c97b4;
          }
          this_00 = (URLInputSource *)XMemory::operator_new(0x30,this->fMemoryManager);
          bVar1 = true;
          LocalFileInputSource::LocalFileInputSource
                    ((LocalFileInputSource *)this_00,systemId,this->fMemoryManager);
        }
        else {
          if (this->fStandardUriConformant != false) {
            bVar1 = XMLURL::hasInvalidChar(&local_88);
            if (bVar1) {
              MalformedURLException::MalformedURLException
                        ((MalformedURLException *)&local_b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLScanner.cpp"
                         ,0x6be,URL_MalformedURL,this->fMemoryManager);
              this->fInException = true;
              emitError(this,XMLException_Fatal,local_b8.fCode,local_b8.fMsg,(XMLCh *)0x0,
                        (XMLCh *)0x0,(XMLCh *)0x0);
              goto LAB_002c97b4;
            }
          }
          this_00 = (URLInputSource *)XMemory::operator_new(0x88,this->fMemoryManager);
          bVar1 = true;
          URLInputSource::URLInputSource(this_00,&local_88,this->fMemoryManager);
        }
      }
      else if (this->fStandardUriConformant == false) {
        this_00 = (URLInputSource *)XMemory::operator_new(0x30,this->fMemoryManager);
        bVar1 = true;
        LocalFileInputSource::LocalFileInputSource
                  ((LocalFileInputSource *)this_00,systemId,this->fMemoryManager);
      }
      else {
        MalformedURLException::MalformedURLException
                  ((MalformedURLException *)&local_b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLScanner.cpp"
                   ,0x6d3,URL_MalformedURL,(MemoryManager *)0x0);
        this->fInException = true;
        emitError(this,XMLException_Fatal,local_b8.fCode,local_b8.fMsg,(XMLCh *)0x0,(XMLCh *)0x0,
                  (XMLCh *)0x0);
LAB_002c97b4:
        XMLException::~XMLException(&local_b8);
        this_00 = (URLInputSource *)0x0;
        bVar1 = false;
      }
      XMLURL::~XMLURL(&local_88);
      if (bVar1) goto LAB_002c96a5;
    }
    pGVar3 = (Grammar *)0x0;
  }
  else {
LAB_002c96a5:
    iVar2 = (*(this->super_XMLBufferFullHandler)._vptr_XMLBufferFullHandler[9])
                      (this,this_00,(ulong)(uint)(int)grammarType,(ulong)toCache);
    pGVar3 = (Grammar *)CONCAT44(extraout_var_00,iVar2);
    if (this_00 != (URLInputSource *)0x0) {
      (*(this_00->super_InputSource)._vptr_InputSource[1])(this_00);
    }
  }
  return pGVar3;
}

Assistant:

Grammar* XMLScanner::loadGrammar(const   XMLCh* const systemId
                                 , const short        grammarType
                                 , const bool         toCache)
{
    InputSource* srcToUse = 0;

    if (fEntityHandler){
        ReaderMgr::LastExtEntityInfo lastInfo;
        fReaderMgr.getLastExtEntityInfo(lastInfo);
        XMLResourceIdentifier resourceIdentifier(XMLResourceIdentifier::ExternalEntity,
                            systemId, 0, XMLUni::fgZeroLenString, lastInfo.systemId,
                            &fReaderMgr);
        srcToUse = fEntityHandler->resolveEntity(&resourceIdentifier);
    }

    //  First we try to parse it as a URL. If that fails, we assume its
    //  a file and try it that way.
    if (!srcToUse) {
        if (fDisableDefaultEntityResolution)
            return 0;

        try
        {
            //  Create a temporary URL. Since this is the primary document,
            //  it has to be fully qualified. If not, then assume we are just
            //  mistaking a file for a URL.
            XMLURL tmpURL(fMemoryManager);

            if (XMLURL::parse(systemId, tmpURL)) {

                if (tmpURL.isRelative())
                {
                    if (!fStandardUriConformant)
                        srcToUse = new (fMemoryManager) LocalFileInputSource(systemId, fMemoryManager);
                    else {
                        // since this is the top of the try/catch, cannot call ThrowXMLwithMemMgr
                        // emit the error directly
                        MalformedURLException e(__FILE__, __LINE__, XMLExcepts::URL_NoProtocolPresent, fMemoryManager);
                        fInException = true;
                        emitError
                        (
                            XMLErrs::XMLException_Fatal
                            , e.getCode()
                            , e.getMessage()
                        );
                        return 0;
                    }
                }
                else
                {
                    if (fStandardUriConformant && tmpURL.hasInvalidChar()) {
                        MalformedURLException e(__FILE__, __LINE__, XMLExcepts::URL_MalformedURL, fMemoryManager);
                        fInException = true;
                        emitError
                        (
                            XMLErrs::XMLException_Fatal
                            , e.getCode()
                            , e.getMessage()
                        );
                        return 0;
                    }
                    srcToUse = new (fMemoryManager) URLInputSource(tmpURL, fMemoryManager);
                }
            }
            else
            {
                if (!fStandardUriConformant)
                    srcToUse = new (fMemoryManager) LocalFileInputSource(systemId, fMemoryManager);
                else {
                    // since this is the top of the try/catch, cannot call ThrowXMLwithMemMgr
                    // emit the error directly
                    // lazy bypass ... since all MalformedURLException are fatal, no need to check the type
                    MalformedURLException e(__FILE__, __LINE__, XMLExcepts::URL_MalformedURL);
                    fInException = true;
                    emitError
                    (
                        XMLErrs::XMLException_Fatal
                        , e.getCode()
                        , e.getMessage()
                    );
                    return 0;
                }
            }
        }
        catch(const XMLException& excToCatch)
        {
            //  For any other XMLException,
            //  emit the error and catch any user exception thrown from here.
            fInException = true;
            if (excToCatch.getErrorType() == XMLErrorReporter::ErrType_Warning)
                emitError
                (
                    XMLErrs::XMLException_Warning
                    , excToCatch.getCode()
                    , excToCatch.getMessage()
                );
            else if (excToCatch.getErrorType() >= XMLErrorReporter::ErrType_Fatal)
                emitError
                (
                    XMLErrs::XMLException_Fatal
                    , excToCatch.getCode()
                    , excToCatch.getMessage()
                );
            else
                emitError
                (
                    XMLErrs::XMLException_Error
                    , excToCatch.getCode()
                    , excToCatch.getMessage()
                );
                return 0;
        }
    }

    Janitor<InputSource> janSrc(srcToUse);
    return loadGrammar(*srcToUse, grammarType, toCache);
}